

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateBlock(ExpressionTranslateContext *ctx,ExprBlock *expression)

{
  ExprBase *local_20;
  ExprBase *value;
  ExprBlock *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  Print(ctx,"{");
  PrintLine(ctx);
  ctx->depth = ctx->depth + 1;
  for (local_20 = (expression->expressions).head; local_20 != (ExprBase *)0x0;
      local_20 = local_20->next) {
    PrintIndent(ctx);
    Translate(ctx,local_20);
    Print(ctx,";");
    PrintLine(ctx);
  }
  if (expression->closures != (ExprBase *)0x0) {
    PrintIndentedLine(ctx,"// Closures");
    PrintIndent(ctx);
    Translate(ctx,expression->closures);
    Print(ctx,";");
    PrintLine(ctx);
  }
  ctx->depth = ctx->depth - 1;
  PrintIndent(ctx);
  Print(ctx,"}");
  return;
}

Assistant:

void TranslateBlock(ExpressionTranslateContext &ctx, ExprBlock *expression)
{
	Print(ctx, "{");
	PrintLine(ctx);

	ctx.depth++;

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		PrintIndent(ctx);

		Translate(ctx, value);

		Print(ctx, ";");

		PrintLine(ctx);
	}

	if(expression->closures)
	{
		PrintIndentedLine(ctx, "// Closures");

		PrintIndent(ctx);

		Translate(ctx, expression->closures);
		Print(ctx, ";");

		PrintLine(ctx);
	}

	ctx.depth--;

	PrintIndent(ctx);
	Print(ctx, "}");
}